

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O3

void __thiscall test_suite::detail::suite_list::insert(suite_list *this,suite_info inf)

{
  size_t sVar1;
  length_error *this_00;
  
  sVar1 = this->count_;
  if (sVar1 != 0x100) {
    this->count_ = sVar1 + 1;
    this->data_[sVar1].name = inf.name;
    this->data_[sVar1].run = inf.run;
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"too many test suites");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void
  insert(suite_info inf)
  {
#ifndef BOOST_NO_EXCEPTIONS
    if(count_ == max_size_)
      throw std::length_error(
          "too many test suites");
#endif
    data_[count_++] = inf;
  }